

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParsePool(ManifestParser *this,string *err)

{
  Lexer *this_00;
  State *this_01;
  bool bVar1;
  int iVar2;
  Pool *pPVar3;
  long *plVar4;
  _Rb_tree_header *p_Var5;
  ulong *puVar6;
  byte unaff_BPL;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  string key;
  string depth_string;
  string name;
  EvalString value;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  EvalString local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadIdent(this_00,&local_68);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    if (!bVar1) {
      unaff_BPL = 0;
      goto LAB_00119df4;
    }
    pPVar3 = State::LookupPool((this->super_Parser).state_,&local_68);
    if (pPVar3 == (Pool *)0x0) {
      local_90 = 0xffffffff;
      do {
        bVar1 = Lexer::PeekToken(this_00,INDENT);
        if (!bVar1) {
          if ((int)local_90 < 0) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"expected \'depth =\' line","");
            unaff_BPL = Lexer::Error(this_00,&local_d0,err);
            uVar7 = local_d0.field_2._M_allocated_capacity;
            _Var8._M_p = local_d0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_00119dec;
          }
          else {
            this_01 = (this->super_Parser).state_;
            pPVar3 = (Pool *)operator_new(0x58);
            (pPVar3->name_)._M_dataplus._M_p = (pointer)&(pPVar3->name_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pPVar3,local_68._M_dataplus._M_p,
                       local_68._M_dataplus._M_p + local_68._M_string_length);
            pPVar3->current_use_ = 0;
            pPVar3->depth_ = (int)local_90;
            p_Var5 = &(pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
            ;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)0x0;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            *(undefined8 *)&(pPVar3->delayed_)._M_t._M_impl = 0;
            *(undefined8 *)&(pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var5->_M_header;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var5->_M_header;
            (pPVar3->delayed_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            unaff_BPL = 1;
            State::AddPool(this_01,pPVar3);
          }
          break;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar1 = ParseLet(this,&local_d0,&local_48,err);
        if (bVar1) {
          iVar2 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar2 != 0) {
            std::operator+(&local_88,"unexpected variable \'",&local_d0);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            puVar6 = (ulong *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar6) {
              local_b0.field_2._M_allocated_capacity = *puVar6;
              local_b0.field_2._8_8_ = plVar4[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *puVar6;
              local_b0._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_b0._M_string_length = plVar4[1];
            *plVar4 = (long)puVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            unaff_BPL = Lexer::Error(this_00,&local_b0,err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00119d5b;
          }
          EvalString::Evaluate_abi_cxx11_(&local_b0,&local_48,&this->env_->super_Env);
          local_90 = atol(local_b0._M_dataplus._M_p);
          bVar1 = -1 < (int)local_90;
          if (!bVar1) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"invalid pool depth","");
            unaff_BPL = Lexer::Error(this_00,&local_88,err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          unaff_BPL = false;
LAB_00119d5b:
          bVar1 = false;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector(&local_48.parsed_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      } while (bVar1);
      goto LAB_00119df4;
    }
    std::operator+(&local_b0,"duplicate pool \'",&local_68);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_d0.field_2._M_allocated_capacity = *puVar6;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar6;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    unaff_BPL = Lexer::Error(this_00,&local_d0,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_b0.field_2._M_allocated_capacity;
    _Var8._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00119df4;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"expected pool name","");
    unaff_BPL = Lexer::Error(this_00,&local_d0,err);
    uVar7 = local_d0.field_2._M_allocated_capacity;
    _Var8._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_00119df4;
  }
LAB_00119dec:
  operator_delete(_Var8._M_p,uVar7 + 1);
LAB_00119df4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ManifestParser::ParsePool(string* err) {
  string name;
  if (!lexer_.ReadIdent(&name))
    return lexer_.Error("expected pool name", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (state_->LookupPool(name) != NULL)
    return lexer_.Error("duplicate pool '" + name + "'", err);

  int depth = -1;

  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString value;
    if (!ParseLet(&key, &value, err))
      return false;

    if (key == "depth") {
      string depth_string = value.Evaluate(env_);
      depth = atol(depth_string.c_str());
      if (depth < 0)
        return lexer_.Error("invalid pool depth", err);
    } else {
      return lexer_.Error("unexpected variable '" + key + "'", err);
    }
  }

  if (depth < 0)
    return lexer_.Error("expected 'depth =' line", err);

  state_->AddPool(new Pool(name, depth));
  return true;
}